

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
bas::Vector<State,_4UL,_bas::RawAllocator>::~Vector(Vector<State,_4UL,_bas::RawAllocator> *this)

{
  State *ptr;
  bool bVar1;
  size_t n;
  Vector<State,_4UL,_bas::RawAllocator> *this_local;
  
  ptr = this->m_begin;
  n = size(this);
  destruct_n<State>(ptr,n);
  bVar1 = is_small(this);
  if (!bVar1) {
    RawAllocator::free((RawAllocator *)&this->field_0x18,this->m_begin);
  }
  return;
}

Assistant:

~Vector()
    {
        destruct_n(m_begin, this->size());
        if (!this->is_small()) {
            m_allocator.free(m_begin);
        }
    }